

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O0

_Bool coll_tmap_contains_value(coll_tmap_t *map,void *value)

{
  entry_t_conflict *local_28;
  entry_t_conflict *cur;
  void *value_local;
  coll_tmap_t *map_local;
  
  local_28 = entry_first(map->root);
  while( true ) {
    if (local_28 == (entry_t_conflict *)0x0) {
      return false;
    }
    if (local_28->val == value) break;
    local_28 = entry_next(local_28);
  }
  return true;
}

Assistant:

bool coll_tmap_contains_value(coll_tmap_t *map, void *value) {
    entry_t *cur = entry_first(map->root);
    while (cur) {
        if (cur->val == value) {
            return true;
        }
        cur = entry_next(cur);
    }
    return false;
}